

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.h
# Opt level: O2

S2Point * __thiscall S2Loop::vertex(S2Loop *this,int i)

{
  uint uVar1;
  ulong uVar2;
  S2LogMessage SStack_18;
  
  if (i < 0) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.h"
               ,0xb1,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: (i) >= (0) ");
  }
  else {
    if (i < this->num_vertices_ * 2) {
      uVar1 = i - this->num_vertices_;
      uVar2 = (ulong)uVar1;
      if ((int)uVar1 < 0) {
        uVar2 = (ulong)(uint)i;
      }
      return this->vertices_ + uVar2;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop.h"
               ,0xb2,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: (i) < (2 * num_vertices()) ");
  }
  abort();
}

Assistant:

const S2Point& vertex(int i) const {
    S2_DCHECK_GE(i, 0);
    S2_DCHECK_LT(i, 2 * num_vertices());
    int j = i - num_vertices();
    return vertices_[j < 0 ? i : j];
  }